

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O3

void Ivy_ObjDeleteFanout(Ivy_Man_t *p,Ivy_Obj_t *pFanin,Ivy_Obj_t *pFanout)

{
  long lVar1;
  long lVar2;
  Ivy_Obj_t **ppIVar3;
  long lVar4;
  long lVar5;
  
  if (pFanin->pFanout == (Ivy_Obj_t *)0x0) {
    __assert_fail("pFanin->pFanout != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFanout.c"
                  ,0xd0,"void Ivy_ObjDeleteFanout(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  if (((ulong)pFanin & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFanout.c"
                  ,0x3b,"Ivy_Obj_t **Ivy_ObjNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  if (((ulong)pFanout & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pFanout)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFanout.c"
                  ,0x3c,"Ivy_Obj_t **Ivy_ObjNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
  }
  if ((Ivy_Obj_t *)((ulong)pFanout->pFanin0 & 0xfffffffffffffffe) == pFanin) {
    lVar2 = 0x38;
    lVar1 = 0x28;
  }
  else {
    if ((Ivy_Obj_t *)((ulong)pFanout->pFanin1 & 0xfffffffffffffffe) != pFanin) {
      __assert_fail("Ivy_ObjFanin1(pFanout) == pObj",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFanout.c"
                    ,0x3f,"Ivy_Obj_t **Ivy_ObjNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
    }
    lVar2 = 0x40;
    lVar1 = 0x30;
  }
  lVar2 = *(long *)((long)&pFanout->Id + lVar2);
  if (lVar2 == 0) {
    ppIVar3 = &pFanin->pFanout;
  }
  else if ((Ivy_Obj_t *)(*(ulong *)(lVar2 + 0x10) & 0xfffffffffffffffe) == pFanin) {
    ppIVar3 = (Ivy_Obj_t **)(lVar2 + 0x28);
  }
  else {
    if ((Ivy_Obj_t *)(*(ulong *)(lVar2 + 0x18) & 0xfffffffffffffffe) != pFanin) {
      __assert_fail("Ivy_ObjFanin1(pTemp) == pObj",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFanout.c"
                    ,0x59,"Ivy_Obj_t **Ivy_ObjPrevNextFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
    }
    ppIVar3 = (Ivy_Obj_t **)(lVar2 + 0x30);
  }
  if (*ppIVar3 == pFanout) {
    *ppIVar3 = *(Ivy_Obj_t **)((long)&pFanout->Id + lVar1);
    if ((Ivy_Obj_t *)((ulong)pFanout->pFanin0 & 0xfffffffffffffffe) == pFanin) {
      lVar4 = 0x28;
      lVar2 = 0x38;
    }
    else {
      if ((Ivy_Obj_t *)((ulong)pFanout->pFanin1 & 0xfffffffffffffffe) != pFanin) {
        __assert_fail("Ivy_ObjFanin1(pFanout) == pObj",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFanout.c"
                      ,0x4a,"Ivy_Obj_t **Ivy_ObjPrevFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
      }
      lVar4 = 0x30;
      lVar2 = 0x40;
    }
    lVar4 = *(long *)((long)&pFanout->Id + lVar4);
    if (lVar4 != 0) {
      if ((Ivy_Obj_t *)(*(ulong *)(lVar4 + 0x10) & 0xfffffffffffffffe) == pFanin) {
        lVar5 = 0x38;
      }
      else {
        lVar5 = 0x40;
        if ((Ivy_Obj_t *)(*(ulong *)(lVar4 + 0x18) & 0xfffffffffffffffe) != pFanin) {
          __assert_fail("Ivy_ObjFanin1(pTemp) == pObj",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFanout.c"
                        ,0x68,"Ivy_Obj_t **Ivy_ObjNextPrevFanoutPlace(Ivy_Obj_t *, Ivy_Obj_t *)");
        }
      }
      if (*(Ivy_Obj_t **)(lVar4 + lVar5) != pFanout) {
        __assert_fail("ppPlaceN == NULL || *ppPlaceN == pFanout",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFanout.c"
                      ,0xda,"void Ivy_ObjDeleteFanout(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
      }
      *(undefined8 *)(lVar4 + lVar5) = *(undefined8 *)((long)&pFanout->Id + lVar2);
    }
    *(undefined8 *)((long)&pFanout->Id + lVar1) = 0;
    *(undefined8 *)((long)&pFanout->Id + lVar2) = 0;
    return;
  }
  __assert_fail("*ppPlaceN == pFanout",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFanout.c"
                ,0xd4,"void Ivy_ObjDeleteFanout(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
}

Assistant:

void Ivy_ObjDeleteFanout( Ivy_Man_t * p, Ivy_Obj_t * pFanin, Ivy_Obj_t * pFanout )
{
    Ivy_Obj_t ** ppPlace1, ** ppPlace2, ** ppPlaceN;
    assert( pFanin->pFanout != NULL );

    ppPlace1 = Ivy_ObjNextFanoutPlace(pFanin, pFanout);
    ppPlaceN = Ivy_ObjPrevNextFanoutPlace(pFanin, pFanout);
    assert( *ppPlaceN == pFanout );
    if ( ppPlaceN )
        *ppPlaceN = *ppPlace1;

    ppPlace2 = Ivy_ObjPrevFanoutPlace(pFanin, pFanout);
    ppPlaceN = Ivy_ObjNextPrevFanoutPlace(pFanin, pFanout);
    assert( ppPlaceN == NULL || *ppPlaceN == pFanout );
    if ( ppPlaceN )
        *ppPlaceN = *ppPlace2;

    *ppPlace1 = NULL;
    *ppPlace2 = NULL;
}